

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_SGIX_async(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_SGIX_async != 0) {
    glad_glAsyncMarkerSGIX = (PFNGLASYNCMARKERSGIXPROC)(*load)("glAsyncMarkerSGIX");
    glad_glFinishAsyncSGIX = (PFNGLFINISHASYNCSGIXPROC)(*load)("glFinishAsyncSGIX");
    glad_glPollAsyncSGIX = (PFNGLPOLLASYNCSGIXPROC)(*load)("glPollAsyncSGIX");
    glad_glGenAsyncMarkersSGIX = (PFNGLGENASYNCMARKERSSGIXPROC)(*load)("glGenAsyncMarkersSGIX");
    glad_glDeleteAsyncMarkersSGIX =
         (PFNGLDELETEASYNCMARKERSSGIXPROC)(*load)("glDeleteAsyncMarkersSGIX");
    glad_glIsAsyncMarkerSGIX = (PFNGLISASYNCMARKERSGIXPROC)(*load)("glIsAsyncMarkerSGIX");
  }
  return;
}

Assistant:

static void load_GL_SGIX_async(GLADloadproc load) {
	if(!GLAD_GL_SGIX_async) return;
	glad_glAsyncMarkerSGIX = (PFNGLASYNCMARKERSGIXPROC)load("glAsyncMarkerSGIX");
	glad_glFinishAsyncSGIX = (PFNGLFINISHASYNCSGIXPROC)load("glFinishAsyncSGIX");
	glad_glPollAsyncSGIX = (PFNGLPOLLASYNCSGIXPROC)load("glPollAsyncSGIX");
	glad_glGenAsyncMarkersSGIX = (PFNGLGENASYNCMARKERSSGIXPROC)load("glGenAsyncMarkersSGIX");
	glad_glDeleteAsyncMarkersSGIX = (PFNGLDELETEASYNCMARKERSSGIXPROC)load("glDeleteAsyncMarkersSGIX");
	glad_glIsAsyncMarkerSGIX = (PFNGLISASYNCMARKERSGIXPROC)load("glIsAsyncMarkerSGIX");
}